

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QHttp2ConfigurationPrivate>::detach_helper
          (QSharedDataPointer<QHttp2ConfigurationPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QHttp2ConfigurationPrivate *pQVar3;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QHttp2ConfigurationPrivate> *in_RDI;
  void *in_R8;
  QHttp2ConfigurationPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x2b1b8b);
  Qt::totally_ordered_wrapper<QHttp2ConfigurationPrivate_*>::get(&in_RDI->d);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x2b1b9d);
  if ((!bVar1) &&
     (pQVar3 = Qt::totally_ordered_wrapper<QHttp2ConfigurationPrivate_*>::get(&in_RDI->d),
     pQVar3 != (QHttp2ConfigurationPrivate *)0x0)) {
    operator_delete(pQVar3,0x18);
  }
  Qt::totally_ordered_wrapper<QHttp2ConfigurationPrivate_*>::reset
            (&in_RDI->d,(QHttp2ConfigurationPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}